

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_field.cc
# Opt level: O1

bool __thiscall Field::DoTraverse(Field *this,DataDepVisitor *visitor)

{
  bool bVar1;
  bool bVar2;
  pointer ppAVar3;
  
  if ((this->type_ == (Type *)0x0) ||
     (bVar1 = DataDepElement::Traverse(&this->type_->super_DataDepElement,visitor), bVar1)) {
    if (this->attrs_ != (AttrList *)0x0) {
      ppAVar3 = (this->attrs_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      bVar1 = ppAVar3 ==
              (this->attrs_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
      if (!bVar1) {
        bVar2 = DataDepElement::Traverse(&(*ppAVar3)->super_DataDepElement,visitor);
        if (bVar2) {
          do {
            ppAVar3 = ppAVar3 + 1;
            bVar1 = ppAVar3 ==
                    (this->attrs_->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
            if (bVar1) goto LAB_0011d02c;
            bVar2 = DataDepElement::Traverse(&(*ppAVar3)->super_DataDepElement,visitor);
          } while (bVar2);
        }
        if (!bVar1) goto LAB_0011d030;
      }
    }
LAB_0011d02c:
    bVar1 = true;
  }
  else {
LAB_0011d030:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Field::DoTraverse(DataDepVisitor* visitor)
	{
	// Check parameterized type
	if ( type_ && ! type_->Traverse(visitor) )
		return false;
	foreach (i, AttrList, attrs_)
		if ( ! (*i)->Traverse(visitor) )
			return false;
	return true;
	}